

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O2

void gai_iterator_reset(_iterator_hdl *hdl)

{
  global_array_t *pgVar1;
  Integer _ndim;
  long lVar2;
  long lVar3;
  
  pgVar1 = GA;
  if ((uint)GA[hdl->g_a + 1000].distr_type < 5) {
    lVar3 = hdl->g_a + 1000;
    switch(GA[hdl->g_a + 1000].distr_type) {
    case 0:
      hdl->count = 0;
      break;
    case 1:
      hdl->offset = 0;
      hdl->iproc = 0;
      hdl->iblock = 0;
      return;
    case 2:
      hdl->offset = 0;
      hdl->iproc = 0;
      lVar2 = (long)pgVar1[lVar3].ndim;
      hdl->proc_index[0] = 0;
      for (lVar3 = 0x53; lVar3 + -0x52 < lVar2; lVar3 = lVar3 + 1) {
        hdl->lo[lVar3 + -1] = 0;
      }
      hdl->index[0] = 0;
      for (lVar3 = 0x5a; lVar3 + -0x59 < lVar2; lVar3 = lVar3 + 1) {
        hdl->lo[lVar3 + -1] = 0;
      }
      break;
    default:
      hdl->offset = 0;
      hdl->iproc = 0;
      lVar2 = (long)pgVar1[lVar3].ndim;
      hdl->proc_index[0] = 0;
      for (lVar3 = 0x53; lVar3 + -0x52 < lVar2; lVar3 = lVar3 + 1) {
        hdl->lo[lVar3 + -1] = 0;
      }
      hdl->index[0] = 0;
      for (lVar3 = 0x5a; lVar3 + -0x59 < lVar2; lVar3 = lVar3 + 1) {
        hdl->lo[lVar3 + -1] = 0;
      }
    }
  }
  return;
}

Assistant:

void gai_iterator_reset(_iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + hdl->g_a;
  if (GA[handle].distr_type == REGULAR) {
    /* Regular data distribution */
    hdl->count = 0;
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* simple block cyclic data distribution */
    hdl->iproc = 0;
    hdl->iblock = 0;
    hdl->offset = 0;
  } else if (GA[handle].distr_type == SCALAPACK) {
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED ||
      GA[handle].distr_type == TILED_IRREG)  {
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  }
}